

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void lodepng_state_copy(LodePNGState *dest,LodePNGState *source)

{
  uint uVar1;
  void *in_RSI;
  void *in_RDI;
  LodePNGInfo *unaff_retaddr;
  LodePNGColorMode *in_stack_ffffffffffffffe8;
  
  lodepng_state_cleanup((LodePNGState *)0xadb888);
  memcpy(in_RDI,in_RSI,0x210);
  lodepng_color_mode_init((LodePNGColorMode *)((long)in_RDI + 0xa8));
  lodepng_info_init((LodePNGInfo *)0xadb8be);
  uVar1 = lodepng_color_mode_copy(in_stack_ffffffffffffffe8,(LodePNGColorMode *)0xadb8db);
  *(uint *)((long)in_RDI + 0x208) = uVar1;
  if (*(int *)((long)in_RDI + 0x208) == 0) {
    uVar1 = lodepng_info_copy((LodePNGInfo *)source,unaff_retaddr);
    *(uint *)((long)in_RDI + 0x208) = uVar1;
  }
  return;
}

Assistant:

void lodepng_state_copy(LodePNGState* dest, const LodePNGState* source) {
  lodepng_state_cleanup(dest);
  *dest = *source;
  lodepng_color_mode_init(&dest->info_raw);
  lodepng_info_init(&dest->info_png);
  dest->error = lodepng_color_mode_copy(&dest->info_raw, &source->info_raw); if(dest->error) return;
  dest->error = lodepng_info_copy(&dest->info_png, &source->info_png); if(dest->error) return;
}